

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

spv_result_t spvtools::val::ImagePass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  spv_target_env sVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  spv_result_t sVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  StorageClass SVar11;
  uint id;
  Op OVar12;
  int32_t iVar13;
  Op OVar14;
  Function *pFVar15;
  Instruction *this;
  Instruction *pIVar16;
  uint uVar17;
  Decoration decor;
  spv_result_t sVar18;
  pointer ppIVar19;
  char *pcVar20;
  ImageTypeInfo info;
  uint64_t ms;
  undefined8 uStack_2b0;
  code *local_2a8;
  code *local_2a0;
  EnumSet<spv::Capability> *local_290;
  DiagnosticStream local_288;
  uint32_t actual_result_type_2;
  Dim DStack_ac;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> consumers;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  uVar1 = (inst->inst_).opcode;
  OVar12 = CONCAT22(0,uVar1);
  bVar5 = anon_unknown_0::IsImplicitLod(OVar12);
  if (bVar5) {
    pFVar15 = ValidationState_t::function(_,inst->function_->id_);
    local_58._8_8_ = 0;
    local_58._2_6_ = 0;
    local_58._0_2_ = uVar1;
    local_40 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2328:44)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2328:44)>
               ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar15->execution_model_limitations_,(value_type *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    pFVar15 = ValidationState_t::function(_,inst->function_->id_);
    local_78._8_8_ = 0;
    local_78._4_4_ = 0;
    local_78._0_4_ = OVar12;
    local_60 = std::
               _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2346:30)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2346:30)>
               ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar15->limitations_,(value_type *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  sVar8 = SPV_SUCCESS;
  sVar18 = SPV_SUCCESS;
  switch(OVar12) {
  case OpImageTexelPointer:
    pIVar16 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar2 = (pIVar16->inst_).opcode;
    if ((uVar2 != 0x20) && (uVar2 != 0x1141)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be a pointer";
      break;
    }
    SVar11 = Instruction::GetOperandAs<spv::StorageClass>(pIVar16,1);
    if (SVar11 != Image) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be a pointer whose Storage Class operand is Image";
      break;
    }
    uVar17 = 0;
    if ((pIVar16->inst_).opcode == 0x20) {
      uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar17);
      if (((1 < OVar12 - OpTypeInt) && (OVar12 != OpTypeVoid)) &&
         ((OVar12 != OpTypeVector ||
          ((bVar5 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,AtomicFloat16VectorNV), !bVar5 ||
           (bVar5 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar17), !bVar5)))))) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = 
        "Expected Result Type to be a pointer whose Type operand must be a scalar numerical type or OpTypeVoid"
        ;
        break;
      }
    }
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
    this = ValidationState_t::FindDef(_,uVar9);
    if ((this == (Instruction *)0x0) || ((this->inst_).opcode != 0x20)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Image to be OpTypePointer";
      break;
    }
    id = Instruction::GetOperandAs<unsigned_int>(this,2);
    OVar12 = ValidationState_t::GetIdOpcode(_,id);
    if (OVar12 != OpTypeImage) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Image to be OpTypePointer with Type OpTypeImage";
      break;
    }
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,id,&info);
    if (!bVar5) goto LAB_00584adb;
    if (((pIVar16->inst_).opcode == 0x20) && (info.sampled_type != uVar17)) {
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,AtomicFloat16VectorNV);
      if ((bVar5) && (bVar5 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar17), bVar5)) {
        OVar12 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
        if ((OVar12 == OpTypeFloat) &&
           (((uVar9 = ValidationState_t::GetDimension(_,uVar17), uVar9 == 2 &&
             (info.format == ImageFormatRg16f)) ||
            ((uVar9 = ValidationState_t::GetDimension(_,uVar17), uVar9 == 4 &&
             (info.format == ImageFormatRgba16f)))))) goto LAB_00583f00;
      }
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = 
      "Expected Image \'Sampled Type\' to be the same as the Type pointed to by Result Type";
      break;
    }
LAB_00583f00:
    if (info.dim == DimTileImageDataEXT) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Image Dim TileImageDataEXT cannot be used with OpImageTexelPointer";
      break;
    }
    if (info.dim == DimSubpassData) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Image Dim SubpassData cannot be used with OpImageTexelPointer";
      break;
    }
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if ((uVar9 == 0) || (bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9), !bVar5)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Coordinate to be integer scalar or vector";
      break;
    }
    if (info.arrayed == 1) {
      if (info.dim == Dim1D) {
        uVar10 = 2;
      }
      else {
        if ((info.dim != Cube) && (info.dim != Dim2D)) {
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected Image \'Dim\' must be one of 1D, 2D, or Cube when Arrayed is 1";
          break;
        }
        uVar10 = 3;
      }
    }
    else {
      uVar10 = 0;
      if (info.arrayed == 0) {
        uVar10 = anon_unknown_0::GetPlaneCoordSize(&info);
      }
    }
    uVar9 = ValidationState_t::GetDimension(_,uVar9);
    if (uVar10 == uVar9) {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,4);
      if ((uVar9 != 0) && (bVar5 = ValidationState_t::IsIntScalarType(_,uVar9), bVar5)) {
        if (info.multisampled == 0) {
          ms = 0;
          uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,4);
          bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar17,&ms);
          if ((!bVar5) || (ms != 0)) {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Sample for Image with MS 0 to be a valid <id> for the value 0";
            break;
          }
        }
        bVar5 = spvIsVulkanEnv(_->context_->target_env);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        if ((info._24_8_ & 0xffffffff) < 0x2a) {
          if ((0x30201000008U >> (info._24_8_ & 0x3f) & 1) != 0) {
            return SPV_SUCCESS;
          }
          if (((0x84UL >> (info._24_8_ & 0x3f) & 1) != 0) &&
             (bVar5 = EnumSet<spv::Capability>::contains
                                (&_->module_capabilities_,AtomicFloat16VectorNV), bVar5)) {
            return SPV_SUCCESS;
          }
        }
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1232,(char *)0x0);
        std::operator<<((ostream *)&local_288,(string *)&ms);
        pcVar20 = 
        "Expected the Image Format in Image to be R64i, R64ui, R32f, R32i, or R32ui for Vulkan environment"
        ;
        goto LAB_00584296;
      }
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Sample to be integer scalar";
      break;
    }
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&local_288,"Expected Coordinate to have ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
    std::operator<<((ostream *)&local_288," components, but given ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
    sVar18 = local_288.error_;
    goto LAB_00584b0a;
  case OpLoad:
  case OpStore:
  case OpCopyMemory:
  case OpCopyMemorySized:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
  case OpGenericPtrMemSemantics:
  case OpInBoundsPtrAccessChain:
  case OpDecorate:
  case OpMemberDecorate:
  case OpDecorationGroup:
  case OpGroupDecorate:
  case OpGroupMemberDecorate:
  case OpMemberDecorate|OpSourceExtension:
  case OpVectorExtractDynamic:
  case OpVectorInsertDynamic:
  case OpVectorShuffle:
  case OpCompositeConstruct:
  case OpCompositeExtract:
  case OpCompositeInsert:
  case OpCopyObject:
  case OpTranspose:
  case OpTranspose|OpUndef:
    goto switchD_0058326b_caseD_13d;
  case OpSampledImage:
    pIVar16 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar16->inst_).opcode == 0x1b) {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
      if (OVar12 == OpTypeImage) {
        info.sampled_type = 0;
        info.dim = DimMax;
        info.depth = 0;
        info.arrayed = 0;
        info.multisampled = 0;
        info.sampled = 0;
        info.format = ImageFormatMax;
        info.access_qualifier = AccessQualifierMax;
        bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar9,&info);
        if (!bVar5) goto LAB_00584adb;
        uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
        if (uVar17 == uVar9) {
LAB_0058402b:
          bVar5 = spvIsVulkanEnv(_->context_->target_env);
          if (bVar5) {
            if (info.sampled != 1) {
              ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1a0f,(char *)0x0);
              std::operator<<((ostream *)&local_288,(string *)&ms);
              pcVar20 = "Expected Image \'Sampled\' parameter to be 1 for Vulkan environment.";
              goto LAB_00584296;
            }
          }
          else if (1 < info.sampled) {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Image \'Sampled\' parameter to be 0 or 1";
            break;
          }
          if (info.dim == DimSubpassData) {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Image \'Dim\' parameter to be not SubpassData.";
          }
          else {
            uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
            OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
            if (OVar12 == OpTypeSampler) {
              ValidationState_t::getSampledImageConsumers(&consumers,_,(inst->inst_).result_id);
              if (consumers.
                  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  consumers.
                  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_290 = &_->module_capabilities_;
                for (ppIVar19 = consumers.
                                super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    ppIVar19 !=
                    consumers.
                    super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppIVar19 = ppIVar19 + 1) {
                  pIVar16 = *ppIVar19;
                  if (pIVar16->block_ != inst->block_) {
                    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_ID,inst);
                    std::operator<<((ostream *)&local_288,
                                    "All OpSampledImage instructions must be in the same block in which their Result <id> are consumed. OpSampledImage Result Type <id> "
                                   );
                    ValidationState_t::getIdName_abi_cxx11_((string *)&ms,_,(inst->inst_).result_id)
                    ;
                    std::operator<<((ostream *)&local_288,(string *)&ms);
                    std::operator<<((ostream *)&local_288,
                                    " has a consumer in a different basic block. The consumer instruction <id> is "
                                   );
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)&actual_result_type_2,_,(pIVar16->inst_).result_id);
                    std::operator<<((ostream *)&local_288,(string *)&actual_result_type_2);
                    std::operator<<((ostream *)&local_288,".");
                    std::__cxx11::string::_M_dispose();
                    std::__cxx11::string::_M_dispose();
                    sVar8 = local_288.error_;
LAB_00585a04:
                    DiagnosticStream::~DiagnosticStream(&local_288);
                    goto LAB_00585a09;
                  }
                  uVar1 = (pIVar16->inst_).opcode;
                  OVar12 = (Op)uVar1;
                  uVar17 = uVar1 - 0x3e;
                  if (uVar17 < 0x2c) {
                    if ((0x84dff200000U >> ((ulong)uVar17 & 0x3f) & 1) == 0) {
                      if ((ulong)uVar17 != 0) goto LAB_005854b9;
                      bVar5 = EnumSet<spv::Capability>::contains(local_290,BindlessTextureNV);
                      if (bVar5) goto LAB_005854ef;
LAB_00585da9:
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_ID,inst);
                      std::operator<<((ostream *)&local_288,
                                      "Result <id> from OpSampledImage instruction must not appear as operand for Op"
                                     );
                      pcVar20 = spvOpcodeString(OVar12);
                      std::operator<<((ostream *)&local_288,pcVar20);
                      std::operator<<((ostream *)&local_288,
                                      ", since it is not specified as taking an ");
                      std::operator<<((ostream *)&local_288,"OpTypeSampledImage.");
                      std::operator<<((ostream *)&local_288," Found result <id> ");
                      ValidationState_t::getIdName_abi_cxx11_
                                ((string *)&ms,_,(inst->inst_).result_id);
                      std::operator<<((ostream *)&local_288,(string *)&ms);
                      std::operator<<((ostream *)&local_288," as an operand of <id> ");
                      ValidationState_t::getIdName_abi_cxx11_
                                ((string *)&actual_result_type_2,_,(pIVar16->inst_).result_id);
                      std::operator<<((ostream *)&local_288,(string *)&actual_result_type_2);
                      std::operator<<((ostream *)&local_288,".");
                      sVar8 = local_288.error_;
                      goto LAB_00585e77;
                    }
                  }
                  else {
LAB_005854b9:
                    if (((0x17 < uVar1 - 0x1180) ||
                        ((0xf0000fU >> (uVar1 - 0x1180 & 0x1f) & 1) == 0)) &&
                       (((10 < uVar1 - 0x131 || ((0x60fU >> (uVar1 - 0x131 & 0x1f) & 1) == 0)) &&
                        (uVar1 != 0x14a3)))) {
                      if ((uVar1 != 0xf5) && (OVar12 != OpSelect)) goto LAB_00585da9;
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_ID,inst);
                      std::operator<<((ostream *)&local_288,
                                      "Result <id> from OpSampledImage instruction must not appear as operands of Op"
                                     );
                      pcVar20 = spvOpcodeString(OVar12);
                      std::operator<<((ostream *)&local_288,pcVar20);
                      std::operator<<((ostream *)&local_288,".");
                      std::operator<<((ostream *)&local_288," Found result <id> ");
                      ValidationState_t::getIdName_abi_cxx11_
                                ((string *)&ms,_,(inst->inst_).result_id);
                      std::operator<<((ostream *)&local_288,(string *)&ms);
                      std::operator<<((ostream *)&local_288," as an operand of <id> ");
                      ValidationState_t::getIdName_abi_cxx11_
                                ((string *)&actual_result_type_2,_,(pIVar16->inst_).result_id);
                      std::operator<<((ostream *)&local_288,(string *)&actual_result_type_2);
                      std::operator<<((ostream *)&local_288,".");
                      sVar8 = local_288.error_;
LAB_00585e77:
                      std::__cxx11::string::_M_dispose();
                      std::__cxx11::string::_M_dispose();
                      goto LAB_00585a04;
                    }
                  }
LAB_005854ef:
                }
              }
              uVar9 = Instruction::GetOperandAs<int>(inst,2);
              pIVar16 = ValidationState_t::FindDef(_,uVar9);
              sVar8 = SPV_SUCCESS;
              if ((pIVar16->inst_).opcode == 0x3d) {
                uVar9 = Instruction::GetOperandAs<int>(pIVar16,2);
                ValidationState_t::RegisterQCOMImageProcessingTextureConsumer(_,uVar9,pIVar16,inst);
              }
LAB_00585a09:
              std::
              _Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
              ::~_Vector_base(&consumers.
                               super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                             );
              return sVar8;
            }
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Sampler to be of type OpTypeSampler";
          }
        }
        else {
          ms = 0x7fffffff00000000;
          uStack_2b0 = 0;
          local_2a8 = (code *)0x0;
          local_2a0 = (code *)0x7fffffff7fffffff;
          bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar17,(ImageTypeInfo *)&ms);
          if (!bVar5) goto LAB_00584adb;
          if (info.sampled_type == (uint32_t)ms) {
            if (info.dim == ms._4_4_) {
              if (info.arrayed == uStack_2b0._4_4_) {
                if (info.multisampled == local_2a8._0_4_) {
                  if (info.sampled == local_2a8._4_4_) {
                    if (info.format == local_2a0._0_4_) {
                      if (info.access_qualifier == local_2a0._4_4_) goto LAB_0058402b;
                    }
                  }
                }
              }
            }
          }
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Image operands must match result image operands except for depth";
        }
      }
      else {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Image to be of type OpTypeImage.";
      }
    }
    else {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be OpTypeSampledImage.";
    }
    break;
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
switchD_0058326b_caseD_131:
    OVar12 = (Op)(inst->inst_).opcode;
    ms = ms & 0xffffffff00000000;
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&ms);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar9 = (uint32_t)ms;
    bVar5 = ValidationState_t::IsIntVectorType(_,(uint32_t)ms);
    if ((!bVar5) && (bVar5 = ValidationState_t::IsFloatVectorType(_,uVar9), !bVar5)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      uVar17 = OVar12 - OpImageSparseSampleImplicitLod;
      if (0xf < (ushort)uVar17) goto LAB_005843da;
LAB_005843cd:
      pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)[uVar17 & 0xffff];
LAB_005843e1:
      std::operator<<((ostream *)&local_288,pcVar20);
      pcVar20 = " to be int or float vector type";
      goto LAB_0058513a;
    }
    uVar10 = ValidationState_t::GetDimension(_,uVar9);
    if (uVar10 != 4) {
LAB_005850db:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      uVar17 = OVar12 - OpImageSparseSampleImplicitLod;
      if ((ushort)uVar17 < 0x10) goto LAB_00585112;
LAB_0058511f:
      pcVar20 = "Result Type";
LAB_00585126:
      std::operator<<((ostream *)&local_288,pcVar20);
      pcVar20 = " to have 4 components";
      goto LAB_0058513a;
    }
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar10);
    if (OVar14 != OpTypeSampledImage) goto LAB_00583b4f;
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
    if (!bVar5) goto LAB_00584adb;
    bVar5 = anon_unknown_0::IsProj(OVar12);
    if ((bVar5) && (sVar8 = anon_unknown_0::ValidateImageProj(_,inst,&info), sVar8 != SPV_SUCCESS))
    {
      return sVar8;
    }
    if (info.multisampled == 0) {
      OVar14 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
      if (OVar14 != OpTypeVoid) {
        uVar9 = ValidationState_t::GetComponentType(_,uVar9);
        if (uVar9 != info.sampled_type) {
LAB_005852ee:
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_288,"Expected Image \'Sampled Type\' to be the same as "
                         );
          uVar17 = OVar12 - OpImageSparseSampleImplicitLod;
          if ((ushort)uVar17 < 0x10) goto LAB_00585325;
LAB_00585332:
          pcVar20 = "Result Type";
          goto LAB_00585339;
        }
      }
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
      if (((OVar12 == OpImageSparseSampleExplicitLod) || (OVar12 == OpImageSampleExplicitLod)) &&
         (bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
         bVar5)) {
        bVar5 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
        if ((!bVar5) && (bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9), !bVar5))
        goto LAB_00584c05;
      }
      else {
        bVar5 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
        if (!bVar5) goto LAB_005855a1;
      }
      uVar10 = anon_unknown_0::GetMinCoordSize(OVar12,&info);
      uVar9 = ValidationState_t::GetDimension(_,uVar9);
      if (uVar10 <= uVar9) {
        puVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((0x17 < (ulong)((long)(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) &&
            ((puVar4[5] & 8) != 0)) &&
           ((bVar5 = spvIsOpenCLEnv(_->context_->target_env), OVar12 == OpImageSampleExplicitLod &&
            (bVar5)))) goto LAB_005856cd;
        goto LAB_00585b0e;
      }
      goto LAB_00585284;
    }
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar20 = "Sampling operation is invalid for multisample image";
    break;
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
switchD_0058326b_caseD_133:
    OVar12 = (Op)(inst->inst_).opcode;
    ms = (ulong)ms._4_4_ << 0x20;
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&ms);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar9 = (uint32_t)ms;
    bVar5 = ValidationState_t::IsIntScalarType(_,(uint32_t)ms);
    if ((!bVar5) && (bVar5 = ValidationState_t::IsFloatScalarType(_,uVar9), !bVar5)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      if ((ushort)(OVar12 - OpImageSparseSampleImplicitLod) < 0x10) {
        pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)
                  [OVar12 - OpImageSparseSampleImplicitLod & 0xffff];
      }
      else {
        pcVar20 = "Result Type";
      }
      std::operator<<((ostream *)&local_288,pcVar20);
      pcVar20 = " to be int or float scalar type";
      goto LAB_0058513a;
    }
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar10);
    if (OVar14 != OpTypeSampledImage) goto LAB_00583b4f;
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
    if (!bVar5) goto LAB_00584adb;
    bVar5 = anon_unknown_0::IsProj(OVar12);
    if ((bVar5) && (sVar8 = anon_unknown_0::ValidateImageProj(_,inst,&info), sVar8 != SPV_SUCCESS))
    {
      return sVar8;
    }
    if (info.multisampled != 0) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Dref sampling operation is invalid for multisample image";
      break;
    }
    if (uVar9 != info.sampled_type) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected Image \'Sampled Type\' to be the same as ");
      if ((ushort)(OVar12 - OpImageSparseSampleImplicitLod) < 0x10) {
        pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)
                  [OVar12 - OpImageSparseSampleImplicitLod & 0xffff];
      }
      else {
        pcVar20 = "Result Type";
      }
      goto LAB_0058513a;
    }
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar5 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
    if (bVar5) {
      uVar10 = anon_unknown_0::GetMinCoordSize(OVar12,&info);
      uVar9 = ValidationState_t::GetDimension(_,uVar9);
      if (uVar10 <= uVar9) {
        sVar8 = anon_unknown_0::ValidateImageDref(_,inst,&info);
joined_r0x0058593a:
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
        goto LAB_005847cb;
      }
      goto LAB_00585284;
    }
LAB_005855a1:
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar20 = "Expected Coordinate to be float scalar or vector";
    break;
  case OpImageFetch:
switchD_0058326b_caseD_139:
    ms = (ulong)ms._4_4_ << 0x20;
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&ms);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    OVar12 = (Op)(inst->inst_).opcode;
    uVar9 = (uint32_t)ms;
    bVar5 = ValidationState_t::IsIntVectorType(_,(uint32_t)ms);
    if ((!bVar5) && (bVar5 = ValidationState_t::IsFloatVectorType(_,uVar9), !bVar5)) {
LAB_00584399:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      uVar17 = OVar12 - OpImageSparseSampleImplicitLod;
      if ((ushort)uVar17 < 0x10) goto LAB_005843cd;
LAB_005843da:
      pcVar20 = "Result Type";
      goto LAB_005843e1;
    }
    uVar10 = ValidationState_t::GetDimension(_,uVar9);
    if (uVar10 != 4) {
LAB_005842d4:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      uVar17 = OVar12 - OpImageSparseSampleImplicitLod;
      if (0xf < (ushort)uVar17) goto LAB_0058511f;
LAB_00585112:
      pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)[uVar17 & 0xffff];
      goto LAB_00585126;
    }
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar10);
    if (OVar14 != OpTypeImage) goto LAB_005842b2;
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
    if (!bVar5) goto LAB_00584adb;
    OVar14 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
    if (OVar14 == OpTypeVoid) {
LAB_00583ac6:
      if (info.dim == Cube) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Image \'Dim\' cannot be Cube";
      }
      else {
        if (info.sampled == 1) {
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
          bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
          if (!bVar5) goto LAB_005852cc;
          uVar10 = anon_unknown_0::GetMinCoordSize(OVar12,&info);
          uVar9 = ValidationState_t::GetDimension(_,uVar9);
          if (uVar10 <= uVar9) goto LAB_00585b0e;
          goto LAB_00585284;
        }
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Image \'Sampled\' parameter to be 1";
      }
      break;
    }
    uVar9 = ValidationState_t::GetComponentType(_,uVar9);
    if (uVar9 == info.sampled_type) goto LAB_00583ac6;
LAB_00584e62:
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&local_288,"Expected Image \'Sampled Type\' to be the same as ");
    uVar17 = OVar12 - OpImageSparseSampleImplicitLod;
    if (0xf < (ushort)uVar17) goto LAB_00585332;
LAB_00585325:
    pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)[uVar17 & 0xffff];
LAB_00585339:
    std::operator<<((ostream *)&local_288,pcVar20);
    pcVar20 = " components";
LAB_0058513a:
    std::operator<<((ostream *)&local_288,pcVar20);
    sVar18 = local_288.error_;
    goto LAB_00584b0a;
  case OpImageGather:
  case OpImageDrefGather:
switchD_0058326b_caseD_13a:
    _actual_result_type_2 = (pointer)((ulong)DStack_ac << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,&actual_result_type_2);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar1 = (inst->inst_).opcode;
    OVar12 = (Op)uVar1;
    uVar9 = actual_result_type_2;
    bVar5 = ValidationState_t::IsIntVectorType(_,actual_result_type_2);
    if ((!bVar5) && (bVar5 = ValidationState_t::IsFloatVectorType(_,uVar9), !bVar5))
    goto LAB_00584399;
    uVar10 = ValidationState_t::GetDimension(_,uVar9);
    if (uVar10 != 4) goto LAB_005842d4;
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar10);
    if (OVar14 == OpTypeSampledImage) {
      info.sampled_type = 0;
      info.dim = DimMax;
      info.depth = 0;
      info.arrayed = 0;
      info.multisampled = 0;
      info.sampled = 0;
      info.format = ImageFormatMax;
      info.access_qualifier = AccessQualifierMax;
      bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
      if (!bVar5) goto LAB_00584adb;
      if (info.multisampled != 0) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Gather operation is invalid for multisample image";
        break;
      }
      if ((uVar1 == 0x61) || (uVar1 == 0x13b)) {
LAB_00584cfa:
        uVar9 = ValidationState_t::GetComponentType(_,uVar9);
        if (uVar9 == info.sampled_type) goto LAB_00584d0e;
        goto LAB_00584e62;
      }
      OVar14 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
      if (OVar14 != OpTypeVoid) goto LAB_00584cfa;
LAB_00584d0e:
      if ((DimRect < info.dim) || ((0x1aU >> (info.dim & 0x1f) & 1) == 0)) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x12a9,(char *)0x0);
        std::operator<<((ostream *)&local_288,(string *)&ms);
        pcVar20 = "Expected Image \'Dim\' to be 2D, Cube, or Rect";
        goto LAB_00584296;
      }
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar5 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
      if (!bVar5) goto LAB_005855a1;
      OVar12 = (Op)uVar1;
      uVar10 = anon_unknown_0::GetMinCoordSize(OVar12,&info);
      uVar9 = ValidationState_t::GetDimension(_,uVar9);
      if (uVar9 < uVar10) goto LAB_0058554f;
      if (OVar12 != OpImageGather) {
        if ((OVar12 != OpImageDrefGather) && (OVar12 != OpImageSparseDrefGather)) {
          if (uVar1 != 0x13a) {
            __assert_fail("opcode == spv::Op::OpImageDrefGather || opcode == spv::Op::OpImageSparseDrefGather"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                          ,0x65c,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageGather(ValidationState_t &, const Instruction *)"
                         );
          }
          goto LAB_00584d91;
        }
        sVar8 = anon_unknown_0::ValidateImageDref(_,inst,&info);
        goto joined_r0x0058593a;
      }
LAB_00584d91:
      uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,4);
      uVar9 = ValidationState_t::GetTypeId(_,uVar17);
      bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
      if ((!bVar5) || (uVar9 = ValidationState_t::GetBitWidth(_,uVar9), uVar9 != 0x20)) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Component to be 32-bit int scalar";
        break;
      }
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      if (bVar5) {
        OVar12 = ValidationState_t::GetIdOpcode(_,uVar17);
        iVar13 = spvOpcodeIsConstant(OVar12);
        if (iVar13 == 0) {
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1238,(char *)0x0);
          std::operator<<((ostream *)&local_288,(string *)&ms);
          pcVar20 = "Expected Component Operand to be a const object for Vulkan environment";
          goto LAB_00584296;
        }
      }
LAB_005847cb:
      uVar9 = 7;
      goto LAB_00585b13;
    }
LAB_00583b4f:
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar20 = "Expected Sampled Image to be of type OpTypeSampledImage";
    break;
  case OpImageRead:
switchD_0058326b_caseD_140:
    uVar1 = (inst->inst_).opcode;
    _actual_result_type_2 = (pointer)((ulong)DStack_ac << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,&actual_result_type_2);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar9 = actual_result_type_2;
    bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,actual_result_type_2);
    if ((!bVar5) && (bVar5 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9), !bVar5)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      if ((ushort)(uVar1 - 0x131) < 0x10) {
        pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)[(ushort)(uVar1 - 0x131)];
      }
      else {
        pcVar20 = "Result Type";
      }
      std::operator<<((ostream *)&local_288,pcVar20);
      pcVar20 = " to be int or float scalar or vector type";
      goto LAB_0058513a;
    }
    sVar3 = _->context_->target_env;
    bVar5 = spvIsVulkanEnv(sVar3);
    if ((bVar5) && (uVar10 = ValidationState_t::GetDimension(_,uVar9), uVar10 != 4)) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&info,_,0x12ac,(char *)0x0);
      std::operator<<((ostream *)&local_288,(string *)&info);
      std::operator<<((ostream *)&local_288,"Expected ");
      if ((ushort)(uVar1 - 0x131) < 0x10) {
        pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)[(ushort)(uVar1 - 0x131)];
      }
      else {
        pcVar20 = "Result Type";
      }
      std::operator<<((ostream *)&local_288,pcVar20);
      std::operator<<((ostream *)&local_288," to have 4 components");
      std::__cxx11::string::_M_dispose();
      sVar18 = local_288.error_;
      goto LAB_00584b0a;
    }
    local_290 = (EnumSet<spv::Capability> *)CONCAT44(local_290._4_4_,(uint)uVar1);
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
    if (OVar12 != OpTypeImage) goto LAB_005842b2;
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
    if (!bVar5) goto LAB_00584adb;
    bVar5 = spvIsOpenCLEnv(sVar3);
    OVar12 = (Op)local_290;
    if (!bVar5) {
LAB_0058509f:
      if (info.dim == DimSubpassData) {
        if (OVar12 == OpImageSparseRead) {
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Image Dim SubpassData cannot be used with ImageSparseRead";
          break;
        }
        pFVar15 = ValidationState_t::function(_,inst->function_->id_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ms,"Dim SubpassData requires Fragment execution model: ",
                   (allocator<char> *)&consumers);
        pcVar20 = spvOpcodeString(OVar12);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ms,
                       pcVar20);
        Function::RegisterExecutionModelLimitation
                  (pFVar15,ExecutionModelFragment,(string *)&local_288);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      if (info.dim == DimTileImageDataEXT) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_288,"Image Dim TileImageDataEXT cannot be used with ");
        pcVar20 = spvOpcodeString(OVar12);
        std::operator<<((ostream *)&local_288,pcVar20);
        sVar18 = local_288.error_;
        goto LAB_00584b0a;
      }
      OVar14 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
      if (OVar14 != OpTypeVoid) {
        uVar9 = ValidationState_t::GetComponentType(_,uVar9);
        if (uVar9 == info.sampled_type) goto LAB_0058522d;
        goto LAB_005852ee;
      }
LAB_0058522d:
      sVar8 = anon_unknown_0::ValidateImageReadWrite(_,inst,&info);
      if (sVar8 != SPV_SUCCESS) {
        return sVar8;
      }
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
      if (!bVar5) goto LAB_005852cc;
      uVar10 = anon_unknown_0::GetMinCoordSize(OVar12,&info);
      uVar9 = ValidationState_t::GetDimension(_,uVar9);
      if (uVar9 < uVar10) goto LAB_00585284;
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      if ((((bVar5) && (info.format == ImageFormatUnknown)) && (info.dim != DimSubpassData)) &&
         (bVar5 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityStorageImageReadWithoutFormat),
         !bVar5)) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_288,
                        "Capability StorageImageReadWithoutFormat is required to ");
        pcVar20 = "read storage image";
        break;
      }
LAB_00585b0e:
      uVar9 = 6;
LAB_00585b13:
      sVar8 = anon_unknown_0::ValidateImageOperands(_,inst,&info,uVar9);
      return sVar8;
    }
    if (info.depth == 0) {
      uVar10 = ValidationState_t::GetDimension(_,uVar9);
      if (uVar10 == 4) goto LAB_00585085;
      goto LAB_005850db;
    }
    bVar5 = ValidationState_t::IsFloatScalarType(_,uVar9);
    if (!bVar5) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,"Expected ");
      if ((ushort)(OVar12 - OpImageSparseSampleImplicitLod) < 0x10) {
        pcVar20 = (&PTR_anon_var_dwarf_269cad1_00901b50)
                  [OVar12 - OpImageSparseSampleImplicitLod & 0xffff];
      }
      else {
        pcVar20 = "Result Type";
      }
      std::operator<<((ostream *)&local_288,pcVar20);
      pcVar20 = " from a depth image read to result in a scalar float value";
      goto LAB_0058513a;
    }
LAB_00585085:
    puVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)((long)(inst->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4) < 0x18) ||
       ((puVar4[5] & 8) == 0)) goto LAB_0058509f;
LAB_005856cd:
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&local_288,"ConstOffset image operand not allowed ");
    pcVar20 = "in the OpenCL environment.";
    break;
  case OpImageWrite:
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,0);
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
    if (OVar12 != OpTypeImage) {
LAB_005842b2:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Image to be of type OpTypeImage";
      break;
    }
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar9,&info);
    if (!bVar5) goto LAB_00584adb;
    if (info.dim == DimTileImageDataEXT) {
LAB_0058456e:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Image \'Dim\' cannot be TileImageDataEXT";
      break;
    }
    if (info.dim == DimSubpassData) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Image \'Dim\' cannot be SubpassData";
      break;
    }
    sVar8 = anon_unknown_0::ValidateImageReadWrite(_,inst,&info);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,1);
    bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
    if (!bVar5) {
LAB_005852cc:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Coordinate to be int scalar or vector";
      break;
    }
    uVar10 = anon_unknown_0::GetMinCoordSize((uint)(inst->inst_).opcode,&info);
    uVar9 = ValidationState_t::GetDimension(_,uVar9);
    if (uVar10 <= uVar9) {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
      if ((bVar5) || (bVar5 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9), bVar5)) {
        OVar12 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
        if (OVar12 != OpTypeVoid) {
          uVar9 = ValidationState_t::GetComponentType(_,uVar9);
          if (uVar9 != info.sampled_type) {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&local_288,
                            "Expected Image \'Sampled Type\' to be the same as Texel ");
            pcVar20 = "components";
            break;
          }
        }
        bVar5 = spvIsVulkanEnv(_->context_->target_env);
        if ((((!bVar5) || (info.format != ImageFormatUnknown)) || (info.dim == DimSubpassData)) ||
           (bVar5 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityStorageImageWriteWithoutFormat),
           bVar5)) {
          if (((ulong)((long)(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) < 0x11) ||
             (bVar5 = spvIsOpenCLEnv(_->context_->target_env), !bVar5)) {
            uVar9 = 5;
            goto LAB_00585b13;
          }
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_288,
                          "Optional Image Operands are not allowed in the OpenCL ");
          pcVar20 = "environment.";
        }
        else {
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_288,
                          "Capability StorageImageWriteWithoutFormat is required to write ");
          pcVar20 = "to storage image";
        }
      }
      else {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Texel to be int or float vector or scalar";
      }
      break;
    }
LAB_00585284:
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&local_288,"Expected Coordinate to have at least ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
    std::operator<<((ostream *)&local_288," components, but given only ");
LAB_00585594:
    std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
    sVar18 = local_288.error_;
    goto LAB_00584b0a;
  case OpImage:
    uVar9 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
    if (OVar12 == OpTypeImage) {
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      pIVar16 = ValidationState_t::FindDef(_,uVar10);
      if (pIVar16 == (Instruction *)0x0) {
        __assert_fail("sampled_image_type_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                      ,0x745,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateImage(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar16->inst_).opcode == 0x1b) {
        if ((pIVar16->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[2] == uVar9) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Sample Image image type to be equal to Result Type";
      }
      else {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Sample Image to be of type OpTypeSampleImage";
      }
    }
    else {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be OpTypeImage";
    }
    break;
  case OpImageQueryFormat:
  case OpImageQueryOrder:
    bVar5 = ValidationState_t::IsIntScalarType(_,(inst->inst_).type_id);
    if (bVar5) {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
      if (OVar12 == OpTypeImage) {
        info.sampled_type = 0;
        info.dim = DimMax;
        info.depth = 0;
        info.arrayed = 0;
        info.multisampled = 0;
        info.sampled = 0;
        info.format = ImageFormatMax;
        info.access_qualifier = AccessQualifierMax;
        bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar9,&info);
        if (bVar5) {
          if (info.dim != DimTileImageDataEXT) {
            return SPV_SUCCESS;
          }
          goto LAB_0058456e;
        }
        goto LAB_00584adb;
      }
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected operand to be of type OpTypeImage";
    }
    else {
LAB_0058388d:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be int scalar type";
    }
    break;
  case OpImageQuerySizeLod:
    uVar9 = (inst->inst_).type_id;
    bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
    if (bVar5) {
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
      if (OVar12 != OpTypeImage) goto LAB_005842b2;
      info.sampled_type = 0;
      info.dim = DimMax;
      info.depth = 0;
      info.arrayed = 0;
      info.multisampled = 0;
      info.sampled = 0;
      info.format = ImageFormatMax;
      info.access_qualifier = AccessQualifierMax;
      bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
      if (!bVar5) goto LAB_00584adb;
      if ((ulong)info._0_8_ >> 0x20 < 4) {
        if (info.multisampled == 0) {
          uVar10 = *(int *)(&DAT_006b90a0 + ((ulong)info._0_8_ >> 0x20) * 4) + info.arrayed;
          bVar5 = spvIsVulkanEnv(_->context_->target_env);
          if ((bVar5) && (info.sampled != 1)) {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1233,(char *)0x0);
            std::operator<<((ostream *)&local_288,(string *)&ms);
            pcVar20 = 
            "OpImageQuerySizeLod must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
            ;
            goto LAB_00584296;
          }
          uVar9 = ValidationState_t::GetDimension(_,uVar9);
          if (uVar9 == uVar10) {
            uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
            bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
            if (bVar5) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Level of Detail to be int scalar";
            break;
          }
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_288,"Result Type has ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
          std::operator<<((ostream *)&local_288," components, ");
          std::operator<<((ostream *)&local_288,"but ");
          goto LAB_005853f3;
        }
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Image \'MS\' must be 0";
      }
      else {
LAB_00584642:
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Image \'Dim\' must be 1D, 2D, 3D or Cube";
      }
    }
    else {
LAB_00584199:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be int scalar or vector type";
    }
    break;
  case OpImageQuerySize:
    uVar9 = (inst->inst_).type_id;
    bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
    if (!bVar5) goto LAB_00584199;
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
    if (OVar12 != OpTypeImage) goto LAB_005842b2;
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar10,&info);
    if (!bVar5) goto LAB_00584adb;
    if (Buffer < info.dim) {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Image \'Dim\' must be 1D, Buffer, 2D, Cube, 3D or Rect";
      break;
    }
    if ((0x1aU >> (info.dim & 0x1f) & 1) == 0) {
      if ((0x21U >> (info.dim & 0x1f) & 1) != 0) {
        iVar7 = 1;
        goto LAB_00584c80;
      }
      uVar10 = info.arrayed + 3;
LAB_00585358:
      if ((info.multisampled != 1) && ((info._16_8_ & 0xfffffffd00000000) != 0)) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Image must have either \'MS\'=1 or \'Sampled\'=0 or \'Sampled\'=2";
        break;
      }
    }
    else {
      iVar7 = 2;
LAB_00584c80:
      uVar10 = iVar7 + info.arrayed;
      if (info.dim < DimRect) goto LAB_00585358;
    }
    uVar9 = ValidationState_t::GetDimension(_,uVar9);
    if (uVar9 == uVar10) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&local_288,"Result Type has ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
    std::operator<<((ostream *)&local_288," components, ");
    std::operator<<((ostream *)&local_288,"but ");
LAB_005853f3:
    std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
    pcVar20 = " expected";
    break;
  case OpImageQueryLod:
    pFVar15 = ValidationState_t::function(_,inst->function_->id_);
    info.sampled_type = 0;
    info.dim = Dim1D;
    info.depth = 0;
    info.arrayed = 0;
    info._24_8_ = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2029:11)>
                  ::_M_invoke;
    info._16_8_ = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2029:11)>
                  ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar15->execution_model_limitations_,(value_type *)&info);
    if (info._16_8_ != 0) {
      (*(code *)info._16_8_)(&info,&info,3);
    }
    pFVar15 = ValidationState_t::function(_,inst->function_->id_);
    ms = 0;
    uStack_2b0 = 0;
    local_2a0 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2044:28)>
                ::_M_invoke;
    local_2a8 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2044:28)>
                ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar15->limitations_,(value_type *)&ms);
    if (local_2a8 != (code *)0x0) {
      (*local_2a8)(&ms,&ms,3);
    }
    uVar9 = (inst->inst_).type_id;
    bVar5 = ValidationState_t::IsFloatVectorType(_,uVar9);
    if (bVar5) {
      uVar9 = ValidationState_t::GetDimension(_,uVar9);
      if (uVar9 != 2) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to have 2 components";
        break;
      }
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
      if (OVar12 != OpTypeSampledImage) {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Image operand to be of type OpTypeSampledImage";
        break;
      }
      _actual_result_type_2 = (pointer)0x7fffffff00000000;
      local_a8 = 0;
      aStack_a0._M_allocated_capacity = 0;
      aStack_a0._8_4_ = ImageFormatMax;
      aStack_a0._12_4_ = AccessQualifierMax;
      bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar9,(ImageTypeInfo *)&actual_result_type_2);
      if (!bVar5) goto LAB_00584adb;
      if (Cube < DStack_ac) goto LAB_00584642;
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
      bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
      if (!bVar5) {
        if (!bVar6) goto LAB_005855a1;
LAB_0058552a:
        uVar10 = anon_unknown_0::GetPlaneCoordSize((ImageTypeInfo *)&actual_result_type_2);
        uVar9 = ValidationState_t::GetDimension(_,uVar9);
        if (uVar10 <= uVar9) {
          return SPV_SUCCESS;
        }
LAB_0058554f:
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_288,"Expected Coordinate to have at least ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
        std::operator<<((ostream *)&local_288," components, but given only ");
        goto LAB_00585594;
      }
      if ((bVar6) || (bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9), bVar5))
      goto LAB_0058552a;
LAB_00584c05:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Coordinate to be int or float scalar or vector";
    }
    else {
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be float vector type";
    }
    break;
  case OpImageQueryLevels:
  case OpImageQuerySamples:
    bVar5 = ValidationState_t::IsIntScalarType(_,(inst->inst_).type_id);
    if (!bVar5) goto LAB_0058388d;
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
    if (OVar12 != OpTypeImage) goto LAB_005842b2;
    info.sampled_type = 0;
    info.dim = DimMax;
    info.depth = 0;
    info.arrayed = 0;
    info.multisampled = 0;
    info.sampled = 0;
    info.format = ImageFormatMax;
    info.access_qualifier = AccessQualifierMax;
    bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar9,&info);
    if (!bVar5) goto LAB_00584adb;
    uVar2 = (inst->inst_).opcode;
    if (uVar2 == 0x6b) {
      if (info.dim == Dim2D) {
        if (info.multisampled == 1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Image \'MS\' must be 1";
      }
      else {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Image \'Dim\' must be 2D";
      }
      break;
    }
    if (uVar2 != 0x6a) {
      __assert_fail("opcode == spv::Op::OpImageQuerySamples",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x87c,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageQueryLevelsOrSamples(ValidationState_t &, const Instruction *)"
                   );
    }
    if (Cube < info.dim) goto LAB_00584642;
    bVar5 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    if (info.sampled == 1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1233,(char *)0x0);
    std::operator<<((ostream *)&local_288,(string *)&ms);
    pcVar20 = 
    "OpImageQueryLevels must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
    ;
LAB_00584296:
    std::operator<<((ostream *)&local_288,pcVar20);
    std::__cxx11::string::_M_dispose();
    sVar18 = local_288.error_;
    goto LAB_00584b0a;
  default:
    sVar18 = sVar8;
    switch(OVar12) {
    case OpImageSparseSampleImplicitLod:
    case OpImageSparseSampleExplicitLod:
      goto switchD_0058326b_caseD_131;
    case OpImageSparseSampleDrefImplicitLod:
    case OpImageSparseSampleDrefExplicitLod:
      goto switchD_0058326b_caseD_133;
    case OpImageSparseSampleProjImplicitLod:
    case OpImageSparseSampleProjExplicitLod:
    case OpImageSparseSampleProjDrefImplicitLod:
    case OpImageSparseSampleProjDrefExplicitLod:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_288,
                      "Instruction reserved for future use, use of this instruction ");
      pcVar20 = "is invalid";
      break;
    case OpImageSparseFetch:
      goto switchD_0058326b_caseD_139;
    case OpImageSparseGather:
    case OpImageSparseDrefGather:
      goto switchD_0058326b_caseD_13a;
    case OpImageSparseTexelsResident:
      bVar5 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
      if (bVar5) {
        uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
        if (bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Resident Code to be int scalar";
      }
      else {
        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to be bool scalar type";
      }
      break;
    case OpNoLine:
    case OpAtomicFlagTestAndSet:
    case OpAtomicFlagClear:
      goto switchD_0058326b_caseD_13d;
    case OpImageSparseRead:
      goto switchD_0058326b_caseD_140;
    default:
      if ((OVar12 - OpImageSampleWeightedQCOM < 0x18) &&
         ((0xf0000fU >> (OVar12 - OpImageSampleWeightedQCOM & 0x1f) & 1) != 0)) {
        uVar1 = (inst->inst_).opcode;
        uVar17 = uVar1 - 0x1182;
        if (uVar17 < 0x16) {
          if ((3U >> (uVar17 & 0x1f) & 1) == 0) {
            if ((0xc0000U >> (uVar17 & 0x1f) & 1) != 0) {
              iVar7 = Instruction::GetOperandAs<int>(inst,2);
              sVar8 = anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration(_,iVar7);
              if (sVar8 != SPV_SUCCESS) {
                return sVar8;
              }
              iVar7 = Instruction::GetOperandAs<int>(inst,4);
              sVar8 = anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration(_,iVar7);
              return sVar8;
            }
            if ((0x300000U >> (uVar17 & 0x1f) & 1) == 0) goto LAB_00583b23;
          }
          iVar7 = Instruction::GetOperandAs<int>(inst,2);
          sVar8 = anon_unknown_0::ValidateImageProcessingQCOMDecoration
                            (_,iVar7,BlockMatchTextureQCOM);
          if (sVar8 != SPV_SUCCESS) {
            return sVar8;
          }
          iVar7 = Instruction::GetOperandAs<int>(inst,4);
          decor = BlockMatchTextureQCOM;
        }
        else {
LAB_00583b23:
          if (uVar1 != 0x1180) {
            return SPV_SUCCESS;
          }
          iVar7 = Instruction::GetOperandAs<int>(inst,4);
          decor = DecorationWeightTextureQCOM;
        }
        sVar8 = anon_unknown_0::ValidateImageProcessingQCOMDecoration(_,iVar7,decor);
        return sVar8;
      }
      if (OVar12 == OpTypeSampledImage) {
        uVar9 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[2];
        OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
        if (OVar12 != OpTypeImage) goto LAB_005842b2;
        info.sampled_type = 0;
        info.dim = DimMax;
        info.depth = 0;
        info.arrayed = 0;
        info.multisampled = 0;
        info.sampled = 0;
        info.format = ImageFormatMax;
        info.access_qualifier = AccessQualifierMax;
        bVar5 = anon_unknown_0::GetImageTypeInfo(_,uVar9,&info);
        if (bVar5) {
          if (1 < info.sampled) {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1231,(char *)0x0);
            std::operator<<((ostream *)&local_288,(string *)&ms);
            pcVar20 = 
            "Sampled image type requires an image type with \"Sampled\" operand set to 0 or 1";
            goto LAB_00584296;
          }
          if (_->version_ < 0x10600) {
            return SPV_SUCCESS;
          }
          if (info.dim != Buffer) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_ID,inst);
          pcVar20 = "In SPIR-V 1.6 or later, sampled image dimension must not be Buffer";
          break;
        }
      }
      else {
        if (OVar12 != OpTypeImage) {
          return SPV_SUCCESS;
        }
        if ((inst->inst_).type_id != 0) {
          __assert_fail("inst->type_id() == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                        ,0x307,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateTypeImage(ValidationState_t &, const Instruction *)"
                       );
        }
        info.sampled_type = 0;
        info.dim = DimMax;
        info.depth = 0;
        info.arrayed = 0;
        info.multisampled = 0;
        info.sampled = 0;
        info.format = ImageFormatMax;
        info.access_qualifier = AccessQualifierMax;
        bVar5 = anon_unknown_0::GetImageTypeInfo
                          (_,(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[1],&info);
        if (bVar5) {
          bVar5 = ValidationState_t::IsIntScalarType(_,info.sampled_type);
          if (bVar5) {
            uVar9 = ValidationState_t::GetBitWidth(_,info.sampled_type);
            if ((uVar9 == 0x40) &&
               (bVar5 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,CapabilityInt64ImageEXT), !bVar5)) {
              ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar20 = "Capability Int64ImageEXT is required when using Sampled Type of 64-bit int"
              ;
              break;
            }
          }
          sVar3 = _->context_->target_env;
          bVar5 = spvIsVulkanEnv(sVar3);
          if (bVar5) {
            bVar5 = ValidationState_t::IsFloatScalarType(_,info.sampled_type);
            if (!bVar5) {
              bVar5 = ValidationState_t::IsIntScalarType(_,info.sampled_type);
              if (bVar5) goto LAB_005836b7;
LAB_005836fe:
              ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1230,(char *)0x0);
              std::operator<<((ostream *)&local_288,(string *)&ms);
              pcVar20 = 
              "Expected Sampled Type to be a 32-bit int, 64-bit int or 32-bit float scalar type for Vulkan environment"
              ;
              goto LAB_00584296;
            }
LAB_005836b7:
            uVar9 = ValidationState_t::GetBitWidth(_,info.sampled_type);
            if (uVar9 != 0x20) {
              uVar9 = ValidationState_t::GetBitWidth(_,info.sampled_type);
              if (uVar9 != 0x40) goto LAB_005836fe;
            }
            uVar9 = ValidationState_t::GetBitWidth(_,info.sampled_type);
            if (uVar9 == 0x40) {
              bVar5 = ValidationState_t::IsFloatScalarType(_,info.sampled_type);
              if (bVar5) goto LAB_005836fe;
            }
          }
          else {
            bVar5 = spvIsOpenCLEnv(sVar3);
            if (bVar5) {
              bVar5 = ValidationState_t::IsVoidType(_,info.sampled_type);
              if (!bVar5) {
                ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar20 = "Sampled Type must be OpTypeVoid in the OpenCL environment.";
                break;
              }
            }
            else {
              OVar12 = ValidationState_t::GetIdOpcode(_,info.sampled_type);
              if ((OpTypeFloat < OVar12) || ((0x680000U >> (OVar12 & OpTypeOpaque) & 1) == 0)) {
                ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                std::operator<<((ostream *)&local_288,"Expected Sampled Type to be either void or");
                std::operator<<((ostream *)&local_288," numerical scalar type");
                sVar8 = local_288.error_;
                DiagnosticStream::~DiagnosticStream(&local_288);
              }
              if (OpTypeFloat < OVar12) {
                return sVar8;
              }
              if ((0x680000U >> (OVar12 & OpTypeOpaque) & 1) == 0) {
                return sVar8;
              }
            }
          }
          if (info.depth < 3) {
            if (info.arrayed < 2) {
              if (info.multisampled < 2) {
                if (info.sampled < 3) {
                  if (info.dim == DimTileImageDataEXT) {
                    bVar5 = ValidationState_t::IsVoidType(_,info.sampled_type);
                    if (bVar5) {
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar20 = "Dim TileImageDataEXT requires Sampled Type to be not OpTypeVoid";
                    }
                    else if (info.sampled == 2) {
                      if (info.format == ImageFormatUnknown) {
                        if (info.depth == 0) {
                          if (info.arrayed == 0) goto LAB_0058585b;
                          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar20 = "Dim TileImageDataEXT requires Arrayed to be 0";
                        }
                        else {
                          ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar20 = "Dim TileImageDataEXT requires Depth to be 0";
                        }
                      }
                      else {
                        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar20 = "Dim TileImageDataEXT requires format Unknown";
                      }
                    }
                    else {
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar20 = "Dim TileImageDataEXT requires Sampled to be 2";
                    }
                  }
                  else if (info.dim == DimSubpassData) {
                    if (info.sampled != 2) {
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                      ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1846,(char *)0x0);
                      std::operator<<((ostream *)&local_288,(string *)&ms);
                      pcVar20 = "Dim SubpassData requires Sampled to be 2";
                      goto LAB_00584296;
                    }
                    if (info.format == ImageFormatUnknown) goto LAB_0058585b;
                    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar20 = "Dim SubpassData requires format Unknown";
                  }
                  else if ((info.sampled != 2 || info.multisampled == 0) ||
                          (bVar5 = EnumSet<spv::Capability>::contains
                                             (&_->module_capabilities_,
                                              CapabilityStorageImageMultisample), bVar5)) {
LAB_0058585b:
                    bVar5 = spvIsOpenCLEnv(sVar3);
                    if (!bVar5) {
LAB_00585ec7:
                      bVar5 = spvIsVulkanEnv(sVar3);
                      if (!bVar5) {
                        return SPV_SUCCESS;
                      }
                      if (info.sampled == 0) {
                        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                        ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1231,(char *)0x0);
                        std::operator<<((ostream *)&local_288,(string *)&ms);
                        pcVar20 = "Sampled must be 1 or 2 in the Vulkan environment.";
                      }
                      else if ((info.dim == DimSubpassData) && (info.arrayed != 0)) {
                        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                        ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x1846,(char *)0x0);
                        std::operator<<((ostream *)&local_288,(string *)&ms);
                        pcVar20 = 
                        "Dim SubpassData requires Arrayed to be 0 in the Vulkan environment";
                      }
                      else {
                        if (info.dim != DimRect) {
                          return SPV_SUCCESS;
                        }
                        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                        ValidationState_t::VkErrorID_abi_cxx11_((string *)&ms,_,0x25a6,(char *)0x0);
                        std::operator<<((ostream *)&local_288,(string *)&ms);
                        pcVar20 = "Dim must not be Rect in the Vulkan environment";
                      }
                      goto LAB_00584296;
                    }
                    if ((info.arrayed == 1) && (Dim2D < info.dim)) {
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                      std::operator<<((ostream *)&local_288,
                                      "In the OpenCL environment, Arrayed may only be set to 1 ");
                      pcVar20 = "when Dim is either 1D or 2D.";
                    }
                    else if (info.multisampled == 0) {
                      if (info.sampled == 0) {
                        if (info.access_qualifier != AccessQualifierMax) goto LAB_00585ec7;
                        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                        std::operator<<((ostream *)&local_288,
                                        "In the OpenCL environment, the optional Access Qualifier");
                        pcVar20 = " must be present.";
                      }
                      else {
                        ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar20 = "Sampled must be 0 in the OpenCL environment.";
                      }
                    }
                    else {
                      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar20 = "MS must be 0 in the OpenCL environment.";
                    }
                  }
                  else {
                    ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar20 = 
                    "Capability StorageImageMultisample is required when using multisampled storage image"
                    ;
                  }
                  break;
                }
                ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
                std::operator<<((ostream *)&local_288,"Invalid Sampled ");
                goto LAB_00584879;
              }
              ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)&local_288,"Invalid MS ");
            }
            else {
              ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)&local_288,"Invalid Arrayed ");
            }
            std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
            pcVar20 = " (must be 0 or 1)";
          }
          else {
            ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&local_288,"Invalid Depth ");
LAB_00584879:
            std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
            pcVar20 = " (must be 0, 1 or 2)";
          }
          break;
        }
      }
LAB_00584adb:
      ValidationState_t::diag(&local_288,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Corrupt image type definition";
    }
  }
  std::operator<<((ostream *)&local_288,pcVar20);
  sVar18 = local_288.error_;
LAB_00584b0a:
  DiagnosticStream::~DiagnosticStream(&local_288);
switchD_0058326b_caseD_13d:
  return sVar18;
}

Assistant:

spv_result_t ImagePass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (IsImplicitLod(opcode)) {
    _.function(inst->function()->id())
        ->RegisterExecutionModelLimitation([opcode](spv::ExecutionModel model,
                                                    std::string* message) {
          if (model != spv::ExecutionModel::Fragment &&
              model != spv::ExecutionModel::GLCompute &&
              model != spv::ExecutionModel::MeshEXT &&
              model != spv::ExecutionModel::TaskEXT) {
            if (message) {
              *message =
                  std::string(
                      "ImplicitLod instructions require Fragment, GLCompute, "
                      "MeshEXT or TaskEXT execution model: ") +
                  spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
    _.function(inst->function()->id())
        ->RegisterLimitation([opcode](const ValidationState_t& state,
                                      const Function* entry_point,
                                      std::string* message) {
          const auto* models = state.GetExecutionModels(entry_point->id());
          const auto* modes = state.GetExecutionModes(entry_point->id());
          if (models &&
              (models->find(spv::ExecutionModel::GLCompute) != models->end() ||
               models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
               models->find(spv::ExecutionModel::TaskEXT) != models->end()) &&
              (!modes ||
               (modes->find(spv::ExecutionMode::DerivativeGroupLinearKHR) ==
                    modes->end() &&
                modes->find(spv::ExecutionMode::DerivativeGroupQuadsKHR) ==
                    modes->end()))) {
            if (message) {
              *message = std::string(
                             "ImplicitLod instructions require "
                             "DerivativeGroupQuadsKHR "
                             "or DerivativeGroupLinearKHR execution mode for "
                             "GLCompute, "
                             "MeshEXT or TaskEXT execution model: ") +
                         spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
  }

  switch (opcode) {
    case spv::Op::OpTypeImage:
      return ValidateTypeImage(_, inst);
    case spv::Op::OpTypeSampledImage:
      return ValidateTypeSampledImage(_, inst);
    case spv::Op::OpSampledImage:
      return ValidateSampledImage(_, inst);
    case spv::Op::OpImageTexelPointer:
      return ValidateImageTexelPointer(_, inst);

    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
      return ValidateImageLod(_, inst);

    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
      return ValidateImageDrefLod(_, inst);

    case spv::Op::OpImageFetch:
    case spv::Op::OpImageSparseFetch:
      return ValidateImageFetch(_, inst);

    case spv::Op::OpImageGather:
    case spv::Op::OpImageDrefGather:
    case spv::Op::OpImageSparseGather:
    case spv::Op::OpImageSparseDrefGather:
      return ValidateImageGather(_, inst);

    case spv::Op::OpImageRead:
    case spv::Op::OpImageSparseRead:
      return ValidateImageRead(_, inst);

    case spv::Op::OpImageWrite:
      return ValidateImageWrite(_, inst);

    case spv::Op::OpImage:
      return ValidateImage(_, inst);

    case spv::Op::OpImageQueryFormat:
    case spv::Op::OpImageQueryOrder:
      return ValidateImageQueryFormatOrOrder(_, inst);

    case spv::Op::OpImageQuerySizeLod:
      return ValidateImageQuerySizeLod(_, inst);
    case spv::Op::OpImageQuerySize:
      return ValidateImageQuerySize(_, inst);
    case spv::Op::OpImageQueryLod:
      return ValidateImageQueryLod(_, inst);

    case spv::Op::OpImageQueryLevels:
    case spv::Op::OpImageQuerySamples:
      return ValidateImageQueryLevelsOrSamples(_, inst);

    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod:
      return ValidateImageSparseLod(_, inst);

    case spv::Op::OpImageSparseTexelsResident:
      return ValidateImageSparseTexelsResident(_, inst);

    case spv::Op::OpImageSampleWeightedQCOM:
    case spv::Op::OpImageBoxFilterQCOM:
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM:
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
      return ValidateImageProcessingQCOM(_, inst);

    default:
      break;
  }

  return SPV_SUCCESS;
}